

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resldexe.cpp
# Opt level: O2

osfildef * __thiscall CResLoader::open_exe_res(CResLoader *this,char *respath,char *restype)

{
  FILE *__stream;
  CVmImageLoaderMres_resload res_ifc;
  CVmImageLoaderMres_resload local_50;
  
  if ((restype != (char *)0x0 && this->exe_filename_ != (char *)0x0) &&
     (__stream = (FILE *)os_exeseek(this->exe_filename_,restype), __stream != (FILE *)0x0)) {
    local_50.super_CVmImageLoaderMres._vptr_CVmImageLoaderMres =
         (_func_int **)&PTR__CVmImageLoaderMres_resload_00347060;
    local_50.respath_ = respath;
    local_50.respath_len_ = strlen(respath);
    local_50.found_ = 0;
    local_50.link_ = (char *)0x0;
    CVmImageLoader::load_resources_from_fp
              ((osfildef *)__stream,this->exe_filename_,&local_50.super_CVmImageLoaderMres);
    if (local_50.found_ == 0) {
      fclose(__stream);
      __stream = (FILE *)0x0;
    }
    else if (local_50.link_ == (char *)0x0) {
      fseek(__stream,(ulong)local_50.res_seek_,0);
    }
    else {
      fclose(__stream);
      __stream = fopen(local_50.link_,"rb");
    }
    CVmImageLoaderMres_resload::~CVmImageLoaderMres_resload(&local_50);
    return (osfildef *)__stream;
  }
  return (osfildef *)0x0;
}

Assistant:

osfildef *CResLoader::open_exe_res(const char *respath,
                                   const char *restype)
{
    osfildef *exe_fp;

    /* 
     *   if we don't have an executable filename stored, or we don't have an
     *   executable resource type ID, we can't load the resource 
     */
    if (exe_filename_ == 0 || restype == 0)
        return 0;
    
    /* find the executable file's resources */
    exe_fp = os_exeseek(exe_filename_, restype);

    /* if we found something, try loading from that file */
    if (exe_fp != 0)
    {
        CVmImageLoaderMres_resload res_ifc(respath);
        
        /* try loading the resources */
        CVmImageLoader::
            load_resources_from_fp(exe_fp, exe_filename_, &res_ifc);
        
        /* check to see if we found it */
        if (res_ifc.found_resource())
        {
            /* check the type */
            if (res_ifc.get_link_fname() != 0)
            {
                /* 
                 *   it's a linked local file - close the exe file and open
                 *   the local file instead 
                 */
                osfcls(exe_fp);
                exe_fp = osfoprb(res_ifc.get_link_fname(), OSFOPRB);
            }
            else
            {
                /* we got an exe resource - seek to the starting byte */
                osfseek(exe_fp, res_ifc.get_resource_seek(), OSFSK_SET);
            }
        }
        else
        {
            /* didn't find it - close and forget the executable file */
            osfcls(exe_fp);
            exe_fp = 0;
        }
    }

    /* return the executable file pointer, if we found the resource */
    return exe_fp;
}